

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

string * __thiscall CTxOut::ToString_abi_cxx11_(string *__return_storage_ptr__,CTxOut *this)

{
  uint uVar1;
  CScript *pCVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  long local_68;
  long local_60;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = this->nValue / 100000000;
  local_68 = this->nValue % 100000000;
  uVar1 = (this->scriptPubKey).super_CScriptBase._size;
  uVar3 = uVar1 - 0x1d;
  pCVar2 = (CScript *)(this->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
    pCVar2 = &this->scriptPubKey;
  }
  s.m_size._0_4_ = uVar3;
  s.m_data = (uchar *)pCVar2;
  s.m_size._4_4_ = 0;
  HexStr_abi_cxx11_(&local_58,s);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_38,&local_58,0,0x1e);
  tinyformat::format<long,long,std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)"CTxOut(nValue=%d.%08d, scriptPubKey=%s)",
             (char *)&local_60,&local_68,(long *)&local_38,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CTxOut::ToString() const
{
    return strprintf("CTxOut(nValue=%d.%08d, scriptPubKey=%s)", nValue / COIN, nValue % COIN, HexStr(scriptPubKey).substr(0, 30));
}